

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::GraphicsTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GraphicsTestInstance *this)

{
  undefined8 *puVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  GraphicsTestInstance *pGVar3;
  bool bVar4;
  deUint32 queueFamilyIndex;
  VkShaderStageFlagBits VVar5;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  ProgramBinary *pPVar6;
  GraphicsPipelineBuilder *pGVar7;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *expectedValues;
  TestStatus *pTVar8;
  VkSpecializationInfo *specInfo;
  allocator<char> local_429;
  IVec2 renderSize;
  RefBase<vk::VkCommandBuffer_s_*> local_418;
  string local_3f8;
  TestStatus *local_3d0;
  VkImageMemoryBarrier barrierColorAttachmentSetInitialLayout;
  VkRect2D renderArea;
  Vec4 local_368;
  VkQueue local_350;
  GraphicsTestInstance *local_348;
  VkDeviceSize vertexBufferOffset;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_338;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined4 local_308;
  VkImageSubresourceRange res;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_2d8;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_2b8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_298;
  GraphicsPipelineBuilder local_278;
  VkDescriptorBufferInfo descriptorBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_198;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_178;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_158;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_138;
  Specialization specialization;
  Buffer resultBuffer;
  Buffer vertexBuffer;
  Image colorImage;
  
  local_3d0 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_350 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_348 = this;
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  renderSize.m_data[0] = 0x20;
  renderSize.m_data[1] = 0x20;
  makeImageCreateInfo((VkImageCreateInfo *)&local_278,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x10);
  Image::Image(&colorImage,vk,device,allocator,(VkImageCreateInfo *)&local_278,
               (MemoryRequirement)0x0);
  res.aspectMask = 1;
  res.baseMipLevel = 0;
  res.levelCount = 1;
  res.baseArrayLayer = 0;
  res.layerCount = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_278,vk,device,
                (VkImage)colorImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_138.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_138.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_138.m_data.object.m_internal._0_4_ = local_278.m_renderSize.m_data[0];
  local_138.m_data.object.m_internal._4_4_ = local_278.m_renderSize.m_data[1];
  local_138.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&local_278);
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_278,0x30,0x80);
  pipeline::Buffer::Buffer
            (&vertexBuffer,vk,device,allocator,(VkBufferCreateInfo *)&local_278,
             (MemoryRequirement)0x1);
  puVar1 = (undefined8 *)
           (vertexBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  *puVar1 = 0xbf800000bf800000;
  puVar1[1] = 0x3f80000000000000;
  puVar1[2] = 0x3f800000bf800000;
  puVar1[3] = 0x3f80000000000000;
  puVar1[4] = 0xbf8000003f800000;
  puVar1[5] = 0x3f80000000000000;
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((vertexBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,0x30);
  pGVar3 = local_348;
  makeBufferCreateInfo((VkBufferCreateInfo *)&local_278,local_348->m_ssboSize,0x20);
  pipeline::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&local_278,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&local_278);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&local_278,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       0x1f);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&specialization,this_00,vk,device,0);
  local_298.m_data.deleter.m_device =
       (VkDevice)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_298.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       specialization.m_entries.
       super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_298.m_data.object.m_internal =
       (deUint64)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_298.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       specialization.m_data.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  specialization.m_entries.
  super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&specialization);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&local_278);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&specialization);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&specialization,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1)
  ;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_278,this_01,vk,device,1,1);
  local_158.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_158.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_158.m_data.object.m_internal._0_4_ = local_278.m_renderSize.m_data[0];
  local_158.m_data.object.m_internal._4_4_ = local_278.m_renderSize.m_data[1];
  local_158.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&local_278);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&specialization);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_278,vk,device,
                    (VkDescriptorPool)local_158.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_298.m_data.object.m_internal);
  local_2b8.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_2b8.m_data.deleter.m_pool.m_internal =
       (deUint64)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_2b8.m_data.object.m_internal._0_4_ = local_278.m_renderSize.m_data[0];
  local_2b8.m_data.object.m_internal._4_4_ = local_278.m_renderSize.m_data[1];
  local_2b8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&local_278);
  descriptorBufferInfo.range = pGVar3->m_ssboSize;
  descriptorBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorBufferInfo.offset = 0;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_278);
  specialization.m_data.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::GenericValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::GenericValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&local_278,
                       (VkDescriptorSet)local_2b8.m_data.object.m_internal,
                       (Location *)&specialization,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &descriptorBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_278);
  Specialization::Specialization(&specialization,&pGVar3->m_specConstants);
  specInfo = (VkSpecializationInfo *)0x0;
  if (specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      specialization.m_entries.
      super__Vector_base<vk::VkSpecializationMapEntry,_std::allocator<vk::VkSpecializationMapEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    specInfo = &specialization.m_specialization;
  }
  pipeline::makeRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_278,vk,device,VK_FORMAT_R8G8B8A8_UNORM)
  ;
  local_338.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_338.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_338.m_data.object.m_internal._0_4_ = local_278.m_renderSize.m_data[0];
  local_338.m_data.object.m_internal._4_4_ = local_278.m_renderSize.m_data[1];
  local_338.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&local_278);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&local_278,vk,device,
                  (VkRenderPass)local_338.m_data.object.m_internal,1,(VkImageView *)&local_138,
                  renderSize.m_data[0],renderSize.m_data[1],1);
  local_178.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_178.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_178.m_data.object.m_internal._0_4_ = local_278.m_renderSize.m_data[0];
  local_178.m_data.object.m_internal._4_4_ = local_278.m_renderSize.m_data[1];
  local_178.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_278);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_278,vk,device,
                     (VkDescriptorSetLayout)local_298.m_data.object.m_internal);
  local_2d8.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_2d8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_2d8.m_data.object.m_internal._0_4_ = local_278.m_renderSize.m_data[0];
  local_2d8.m_data.object.m_internal._4_4_ = local_278.m_renderSize.m_data[1];
  local_2d8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_278);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_278,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_198.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_198.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_198.m_data.object.m_internal._0_4_ = local_278.m_renderSize.m_data[0];
  local_198.m_data.object.m_internal._4_4_ = local_278.m_renderSize.m_data[1];
  local_198.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_278);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_278,vk,device,
                    (VkCommandPool)local_198.m_data.object.m_internal);
  local_418.m_data.deleter.m_device =
       (VkDevice)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_deviceIface;
  local_418.m_data.deleter.m_pool.m_internal =
       (deUint64)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_device;
  local_418.m_data.object = (VkCommandBuffer_s *)local_278.m_renderSize.m_data;
  local_418.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_278.m_renderSize.m_data[0] = 0;
  local_278.m_renderSize.m_data[1] = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_278);
  memset(&local_278.m_vertexShaderModule,0,0xbc);
  local_278.m_renderSize.m_data = renderSize.m_data;
  pPVar2 = ((pGVar3->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&barrierColorAttachmentSetInitialLayout,"vert",(allocator<char> *)&renderArea
            );
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (pPVar2,(string *)&barrierColorAttachmentSetInitialLayout);
  pGVar7 = GraphicsPipelineBuilder::setShader
                     (&local_278,vk,device,VK_SHADER_STAGE_VERTEX_BIT,pPVar6,specInfo);
  pPVar2 = ((pGVar3->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"frag",(allocator<char> *)&local_368);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_3f8);
  GraphicsPipelineBuilder::setShader(pGVar7,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar6,specInfo);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&barrierColorAttachmentSetInitialLayout);
  VVar5 = pGVar3->m_stage;
  if ((VVar5 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) ||
     (VVar5 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)) {
    pPVar2 = ((pGVar3->super_TestInstance).m_context)->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&barrierColorAttachmentSetInitialLayout,"tesc",
               (allocator<char> *)&renderArea);
    pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                       (pPVar2,(string *)&barrierColorAttachmentSetInitialLayout);
    pGVar7 = GraphicsPipelineBuilder::setShader
                       (&local_278,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar6,
                        specInfo);
    pPVar2 = ((pGVar3->super_TestInstance).m_context)->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"tese",(allocator<char> *)&local_368);
    pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,&local_3f8);
    GraphicsPipelineBuilder::setShader
              (pGVar7,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar6,specInfo);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&barrierColorAttachmentSetInitialLayout);
    VVar5 = pGVar3->m_stage;
  }
  if (VVar5 == VK_SHADER_STAGE_GEOMETRY_BIT) {
    pPVar2 = ((pGVar3->super_TestInstance).m_context)->m_progCollection;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&barrierColorAttachmentSetInitialLayout,"geom",
               (allocator<char> *)&local_3f8);
    pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                       (pPVar2,(string *)&barrierColorAttachmentSetInitialLayout);
    GraphicsPipelineBuilder::setShader
              (&local_278,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar6,specInfo);
    std::__cxx11::string::~string((string *)&barrierColorAttachmentSetInitialLayout);
  }
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&barrierColorAttachmentSetInitialLayout,
             &local_278,vk,device,(VkPipelineLayout)local_2d8.m_data.object.m_internal,
             (VkRenderPass)local_338.m_data.object.m_internal);
  local_3f8.field_2._M_allocated_capacity._0_4_ =
       barrierColorAttachmentSetInitialLayout.srcAccessMask;
  local_3f8.field_2._M_allocated_capacity._4_4_ =
       barrierColorAttachmentSetInitialLayout.dstAccessMask;
  local_3f8.field_2._8_4_ = barrierColorAttachmentSetInitialLayout.oldLayout;
  local_3f8.field_2._12_4_ = barrierColorAttachmentSetInitialLayout.newLayout;
  local_3f8._M_dataplus._M_p = (pointer)barrierColorAttachmentSetInitialLayout._0_8_;
  local_3f8._M_string_length = (size_type)barrierColorAttachmentSetInitialLayout.pNext;
  barrierColorAttachmentSetInitialLayout.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrierColorAttachmentSetInitialLayout._4_4_ = 0;
  barrierColorAttachmentSetInitialLayout.pNext = (void *)0x0;
  barrierColorAttachmentSetInitialLayout.srcAccessMask = 0;
  barrierColorAttachmentSetInitialLayout.dstAccessMask = 0;
  barrierColorAttachmentSetInitialLayout.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  barrierColorAttachmentSetInitialLayout.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&barrierColorAttachmentSetInitialLayout);
  renderArea.offset.x = 0;
  renderArea.offset.y = 0;
  renderArea.extent.width = renderSize.m_data[0];
  renderArea.extent.height = renderSize.m_data[1];
  local_368.m_data[0] = 0.0;
  local_368.m_data[1] = 0.0;
  local_368.m_data[2] = 0.0;
  local_368.m_data[3] = 1.0;
  vertexBufferOffset = 0;
  beginCommandBuffer(vk,local_418.m_data.object);
  local_318 = 1;
  uStack_310 = 1;
  local_308 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&barrierColorAttachmentSetInitialLayout,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                      .m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_418.m_data.object,0x4000,0x400,0,0,0,0,0,1,
             &barrierColorAttachmentSetInitialLayout);
  beginRenderPass(vk,local_418.m_data.object,(VkRenderPass)local_338.m_data.object.m_internal,
                  (VkFramebuffer)local_178.m_data.object.m_internal,&renderArea,&local_368);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_418.m_data.object,0,local_3f8._M_dataplus._M_p);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_418.m_data.object,0,local_2d8.m_data.object.m_internal,0,1,(int)&local_2b8,0,0
            );
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,local_418.m_data.object,0,1,&vertexBuffer,&vertexBufferOffset);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_418.m_data.object,3,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_418.m_data.object);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&barrierColorAttachmentSetInitialLayout,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,pGVar3->m_ssboSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_418.m_data.object,0x8000,0x4000,0,0,0,1,
             (int)&barrierColorAttachmentSetInitialLayout,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_418.m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineSpecConstantTests.cpp"
                    ,0x2ad);
  submitCommandsAndWait(vk,device,local_350,local_418.m_data.object);
  expectedValues =
       (vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
        *)(resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
          m_offset;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,(VkDeviceSize)expectedValues,pGVar3->m_ssboSize);
  bVar4 = verifyValues((anon_unknown_0 *)((pGVar3->super_TestInstance).m_context)->m_testCtx->m_log,
                       (TestLog *)
                       (resultBuffer.m_allocation.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                       .ptr)->m_hostPtr,&pGVar3->m_expectedValues,expectedValues);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&barrierColorAttachmentSetInitialLayout,"Success",&local_429);
    pTVar8 = local_3d0;
    tcu::TestStatus::pass(local_3d0,(string *)&barrierColorAttachmentSetInitialLayout);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&barrierColorAttachmentSetInitialLayout,"Values did not match",&local_429);
    pTVar8 = local_3d0;
    tcu::TestStatus::fail(local_3d0,(string *)&barrierColorAttachmentSetInitialLayout);
  }
  std::__cxx11::string::~string((string *)&barrierColorAttachmentSetInitialLayout);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_3f8);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_278);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_418);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_198);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_2d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_178);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_338);
  Specialization::~Specialization(&specialization);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_2b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_158);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_298);
  pipeline::Buffer::~Buffer(&resultBuffer);
  pipeline::Buffer::~Buffer(&vertexBuffer);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_138);
  Image::~Image(&colorImage);
  return pTVar8;
}

Assistant:

tcu::TestStatus GraphicsTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2          renderSize    = tcu::IVec2(32, 32);
	const VkFormat            imageFormat   = VK_FORMAT_R8G8B8A8_UNORM;
	const Image               colorImage    (vk, device, allocator, makeImageCreateInfo(renderSize, imageFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT), MemoryRequirement::Any);
	const Unique<VkImageView> colorImageView(makeImageView(vk, device, *colorImage, VK_IMAGE_VIEW_TYPE_2D, imageFormat, makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u)));

	// Vertex buffer

	const deUint32     numVertices           = 3;
	const VkDeviceSize vertexBufferSizeBytes = sizeof(tcu::Vec4) * numVertices;
	const Buffer       vertexBuffer          (vk, device, allocator, makeBufferCreateInfo(vertexBufferSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		tcu::Vec4* pVertices = reinterpret_cast<tcu::Vec4*>(alloc.getHostPtr());

		pVertices[0] = tcu::Vec4(-1.0f, -1.0f,  0.0f,  1.0f);
		pVertices[1] = tcu::Vec4(-1.0f,  1.0f,  0.0f,  1.0f);
		pVertices[2] = tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f);

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexBufferSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Descriptors

	const Buffer resultBuffer(vk, device, allocator, makeBufferCreateInfo(m_ssboSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_ALL_GRAPHICS)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet        (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  descriptorBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, m_ssboSize);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	// Specialization

	const Specialization        specialization (m_specConstants);
	const VkSpecializationInfo* pSpecInfo      = specialization.getSpecializationInfo();

	// Pipeline

	const Unique<VkRenderPass>     renderPass    (makeRenderPass    (vk, device, imageFormat));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebuffer	(vk, device, *renderPass, 1u, &colorImageView.get(), static_cast<deUint32>(renderSize.x()), static_cast<deUint32>(renderSize.y())));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (createCommandPool (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (makeCommandBuffer (vk, device, *cmdPool));

	GraphicsPipelineBuilder pipelineBuilder;
	pipelineBuilder
		.setRenderSize(renderSize)
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,   m_context.getBinaryCollection().get("vert"), pSpecInfo)
		.setShader(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("frag"), pSpecInfo);

	if ((m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) || (m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT))
		pipelineBuilder
			.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,    m_context.getBinaryCollection().get("tesc"), pSpecInfo)
			.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), pSpecInfo);

	if (m_stage == VK_SHADER_STAGE_GEOMETRY_BIT)
		pipelineBuilder
			.setShader(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT, m_context.getBinaryCollection().get("geom"), pSpecInfo);

	const Unique<VkPipeline> pipeline (pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

	// Draw commands

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(renderSize.x(), renderSize.y()),
	};
	const tcu::Vec4    clearColor         (0.0f, 0.0f, 0.0f, 1.0f);
	const VkDeviceSize vertexBufferOffset = 0ull;

	beginCommandBuffer(vk, *cmdBuffer);

	{
		const VkImageSubresourceRange imageFullSubresourceRange              = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		const VkImageMemoryBarrier    barrierColorAttachmentSetInitialLayout = makeImageMemoryBarrier(
			0u, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorImage, imageFullSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &barrierColorAttachmentSetInitialLayout);
	}

	beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);

	vk.cmdBindPipeline      (*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	vk.cmdBindVertexBuffers (*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);

	vk.cmdDraw(*cmdBuffer, numVertices, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, m_ssboSize);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_ssboSize);

	if (verifyValues(m_context.getTestContext().getLog(), resultAlloc.getHostPtr(), m_expectedValues))
		return tcu::TestStatus::pass("Success");
	else
		return tcu::TestStatus::fail("Values did not match");
}